

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pData,
          size_t a_uDataLen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  SI_Error rc;
  bool bCopyStrings;
  char *pComment;
  char *pVal;
  char *pItem;
  char *pSection;
  char *pWork;
  char *pData;
  size_t uLen;
  size_t sStack_28;
  SI_ConvertA<char> converter;
  size_t a_uDataLen_local;
  char *a_pData_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  sStack_28 = a_uDataLen;
  SI_ConvertA<char>::SI_ConvertA
            ((SI_ConvertA<char> *)((long)&uLen + 7),(bool)(this->m_bStoreIsUtf8 & 1));
  if (sStack_28 == 0) {
    this_local._4_4_ = SI_OK;
  }
  else {
    a_uDataLen_local = (size_t)a_pData;
    if ((((this->m_bStoreIsUtf8 & 1U) != 0) && (2 < sStack_28)) &&
       (iVar3 = memcmp(a_pData,anon_var_dwarf_36dbb,3), iVar3 == 0)) {
      a_uDataLen_local = (size_t)(a_pData + 3);
      sStack_28 = sStack_28 - 3;
    }
    pData = (char *)SI_ConvertA<char>::SizeFromStore
                              ((SI_ConvertA<char> *)((long)&uLen + 7),(char *)a_uDataLen_local,
                               sStack_28);
    if (pData == (char *)0xffffffffffffffff) {
      this_local._4_4_ = SI_FAIL;
    }
    else {
      pWork = (char *)operator_new__((ulong)(pData + 1));
      if (pWork == (char *)0x0) {
        this_local._4_4_ = SI_NOMEM;
      }
      else {
        memset(pWork,0,(size_t)(pData + 1));
        bVar1 = SI_ConvertA<char>::ConvertFromStore
                          ((SI_ConvertA<char> *)((long)&uLen + 7),(char *)a_uDataLen_local,sStack_28
                           ,pWork,(size_t)pData);
        if (bVar1) {
          pSection = pWork;
          pItem = "";
          pVal = (char *)0x0;
          pComment = (char *)0x0;
          _rc = (char *)0x0;
          bVar1 = this->m_pData != (char *)0x0;
          this_local._4_4_ = FindFileComment(this,&pSection,bVar1);
          while (SI_FAIL < this_local._4_4_) {
            bVar2 = FindEntry(this,&pSection,&pItem,&pVal,&pComment,(char **)&rc);
            if (!bVar2) {
              if (bVar1) {
                if (pWork != (char *)0x0) {
                  operator_delete__(pWork);
                }
              }
              else {
                this->m_pData = pWork;
                this->m_uDataLen = (size_t)(pData + 1);
              }
              return SI_OK;
            }
            this_local._4_4_ = AddEntry(this,pItem,pVal,pComment,_rc,false,bVar1);
          }
        }
        else {
          if (pWork != (char *)0x0) {
            operator_delete__(pWork);
          }
          this_local._4_4_ = SI_FAIL;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::LoadData(const char *a_pData, size_t a_uDataLen) {
	SI_CONVERTER converter(m_bStoreIsUtf8);

	if (a_uDataLen == 0) {
		return SI_OK;
	}

	// consume the UTF-8 BOM if it exists
	if (m_bStoreIsUtf8 && a_uDataLen >= 3) {
		if (memcmp(a_pData, SI_UTF8_SIGNATURE, 3) == 0) {
			a_pData += 3;
			a_uDataLen -= 3;
		}
	}

	// determine the length of the converted data
	size_t uLen = converter.SizeFromStore(a_pData, a_uDataLen);
	if (uLen == (size_t)(-1)) {
		return SI_FAIL;
	}

	// allocate memory for the data, ensure that there is a NULL
	// terminator wherever the converted data ends
	SI_CHAR *pData = new SI_CHAR[uLen + 1];
	if (!pData) {
		return SI_NOMEM;
	}
	memset(pData, 0, sizeof(SI_CHAR) * (uLen + 1));

	// convert the data
	if (!converter.ConvertFromStore(a_pData, a_uDataLen, pData, uLen)) {
		delete[] pData;
		return SI_FAIL;
	}

	// parse it
	const static SI_CHAR empty = 0;
	SI_CHAR *pWork = pData;
	const SI_CHAR *pSection = &empty;
	const SI_CHAR *pItem = NULL;
	const SI_CHAR *pVal = NULL;
	const SI_CHAR *pComment = NULL;

	// We copy the strings if we are loading data into this class when we
	// already have stored some.
	bool bCopyStrings = (m_pData != NULL);

	// find a file comment if it exists, this is a comment that starts at the
	// beginning of the file and continues until the first blank line.
	SI_Error rc = FindFileComment(pWork, bCopyStrings);
	if (rc < 0) return rc;

	// add every entry in the file to the data table
	while (FindEntry(pWork, pSection, pItem, pVal, pComment)) {
		rc = AddEntry(pSection, pItem, pVal, pComment, false, bCopyStrings);
		if (rc < 0) return rc;
	}

	// store these strings if we didn't copy them
	if (bCopyStrings) {
		delete[] pData;
	} else {
		m_pData = pData;
		m_uDataLen = uLen + 1;
	}

	return SI_OK;
}